

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O2

slReturn parseBool(void *ptrArg,int intArg,optionDef_slOptions *def,char *arg,
                  clientData_slOptions *clientData)

{
  void *pvVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  slReturn pvVar4;
  
  *(undefined4 *)ptrArg = 0;
  if (arg != (char *)0x0) {
    pvVar1 = memchr("yYtT1",(int)*arg,6);
    *(uint *)ptrArg = (uint)(pvVar1 != (void *)0x0);
    sVar2 = strlen(arg);
    if (1 < sVar2) {
      pp_Var3 = __ctype_tolower_loc();
      if (((*pp_Var3)[*arg] == 0x6f) && ((*pp_Var3)[arg[1]] == 0x6e)) {
        *(undefined4 *)ptrArg = 1;
      }
    }
  }
  pvVar4 = makeOkReturn();
  return pvVar4;
}

Assistant:

static slReturn parseBool(void* ptrArg, int intArg, const optionDef_slOptions* def, const char* arg, clientData_slOptions* clientData) {

    // see if we've got anything that like a yes or true (otherwise, we make it a false)...
    *((int*)ptrArg) = 0;
    if (arg) {
        *((int*)ptrArg) = (strchr("yYtT1", *arg) != NULL ? 1 : 0);
        // now look for "on" and treat it as true
        if (strlen(arg) > 1) {
            if ((tolower(arg[0]) == 'o') && (tolower(arg[1]) == 'n')) {
                *((int*)ptrArg) = 1;
            }
        }
    }
    // then return with no error...
    return makeOkReturn();
}